

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O2

void __thiscall dg::llvmdg::SDGBuilder::buildFuns(SDGBuilder *this)

{
  Module *pMVar1;
  char cVar2;
  DependenceGraph *dg;
  Module *pMVar3;
  Module *F;
  
  pMVar1 = this->_module;
  for (pMVar3 = pMVar1 + 0x20; pMVar3 = *(Module **)pMVar3, pMVar3 != pMVar1 + 0x18;
      pMVar3 = pMVar3 + 8) {
    F = pMVar3 + -0x38;
    if (pMVar3 == (Module *)0x0) {
      F = (Module *)0x0;
    }
    cVar2 = llvm::GlobalValue::isDeclaration();
    if (cVar2 == '\0') {
      dg = getOrCreateDG(this,(Function *)F);
      buildDG(this,dg,(Function *)F);
    }
  }
  return;
}

Assistant:

void buildFuns() {
        DBG_SECTION_BEGIN(sdg, "Building functions");
        // build dependence graph for each procedure
        for (auto &F : *_module) {
            if (F.isDeclaration()) {
                continue;
            }

            auto &g = getOrCreateDG(&F);
            buildDG(g, F);
        }
        DBG_SECTION_END(sdg, "Done building functions");
    }